

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineReferenceRenderer.cpp
# Opt level: O1

TestFunc vkt::pipeline::mapVkCompareOp(VkCompareOp compareFunc)

{
  TestFunc TVar1;
  
  TVar1 = TESTFUNC_LAST;
  if (compareFunc < VK_COMPARE_OP_LAST) {
    TVar1 = *(TestFunc *)(&DAT_00b16274 + (ulong)compareFunc * 4);
  }
  return TVar1;
}

Assistant:

rr::TestFunc mapVkCompareOp (VkCompareOp compareFunc)
{
	switch (compareFunc)
	{
		case VK_COMPARE_OP_NEVER:				return rr::TESTFUNC_NEVER;
		case VK_COMPARE_OP_LESS:				return rr::TESTFUNC_LESS;
		case VK_COMPARE_OP_EQUAL:				return rr::TESTFUNC_EQUAL;
		case VK_COMPARE_OP_LESS_OR_EQUAL:		return rr::TESTFUNC_LEQUAL;
		case VK_COMPARE_OP_GREATER:				return rr::TESTFUNC_GREATER;
		case VK_COMPARE_OP_NOT_EQUAL:			return rr::TESTFUNC_NOTEQUAL;
		case VK_COMPARE_OP_GREATER_OR_EQUAL:	return rr::TESTFUNC_GEQUAL;
		case VK_COMPARE_OP_ALWAYS:				return rr::TESTFUNC_ALWAYS;
		default:
			DE_ASSERT(false);
	}
	return rr::TESTFUNC_LAST;
}